

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterReader.cpp
# Opt level: O2

void __thiscall
ParameterReader::phraseOneLine(ParameterReader *this,string *str,string *commentSymbol)

{
  int iVar1;
  string sStack_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_68,(string *)str);
  AfterburnerUtil::trim(&local_48,&local_68);
  iVar1 = std::__cxx11::string::compare((char *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&local_a8,(string *)str);
    std::__cxx11::string::string((string *)&sStack_c8,(string *)commentSymbol);
    removeComments(&local_88,(ParameterReader *)commentSymbol,&local_a8,&sStack_c8);
    phraseEquationWithoutComments(this,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&sStack_c8);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return;
}

Assistant:

void ParameterReader::phraseOneLine(string str, string commentSymbol) {
    /*
      Interpret a string like " x  = 1.1  #bla " to get the associated parameter
      name and value information, and put them into the internal variables
      "names" and "values".
    */
    if (trim(str).compare("") == 0) return;
    phraseEquationWithoutComments(removeComments(str, commentSymbol));
}